

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

void Abc_ExactNormalizeArrivalTimesForNetwork(int nVars,int *pArrTimeProfile,char *pSol)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p;
  int *piVar6;
  int iVar7;
  long lVar8;
  size_t __size;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int nMax;
  
  uVar11 = (uint)pSol[2];
  p = (Vec_Int_t *)malloc(0x10);
  p->nSize = nVars;
  p->nCap = nVars;
  __size = (long)nVars << 2;
  piVar6 = (int *)malloc(__size);
  p->pArray = piVar6;
  memcpy(piVar6,pArrTimeProfile,__size);
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar11) {
    uVar10 = (ulong)uVar11;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    cVar1 = pSol[uVar9 * 4 + 6];
    iVar3 = Vec_IntEntry(p,(int)pSol[uVar9 * 4 + 5]);
    iVar4 = Vec_IntEntry(p,(int)cVar1);
    if (iVar3 <= iVar4) {
      iVar3 = iVar4;
    }
    Vec_IntPush(p,iVar3 + 1);
  }
  iVar7 = nVars + uVar11 + -1;
  iVar3 = 0;
  iVar4 = 0;
  if (0 < iVar7) {
    iVar3 = iVar7;
    iVar4 = 0;
  }
  for (; iVar3 != iVar4; iVar4 = iVar4 + 1) {
    iVar5 = Vec_IntEntry(p,iVar7);
    Vec_IntSetEntry(p,iVar4,iVar5);
  }
  lVar8 = (long)(int)uVar11;
  while (0 < lVar8) {
    cVar1 = pSol[lVar8 * 4 + 1];
    cVar2 = pSol[lVar8 * 4 + 2];
    iVar4 = Vec_IntEntry(p,(int)cVar1);
    iVar5 = (int)lVar8 + nVars + -1;
    iVar7 = Vec_IntEntry(p,iVar5);
    iVar3 = iVar7 + -1;
    if (iVar4 < iVar7 + -1) {
      iVar3 = iVar4;
    }
    Vec_IntSetEntry(p,(int)cVar1,iVar3);
    iVar4 = Vec_IntEntry(p,(int)cVar2);
    iVar7 = Vec_IntEntry(p,iVar5);
    iVar3 = iVar7 + -1;
    if (iVar4 < iVar7 + -1) {
      iVar3 = iVar4;
    }
    Vec_IntSetEntry(p,(int)cVar2,iVar3);
    lVar8 = lVar8 + -1;
  }
  piVar6 = p->pArray;
  Abc_NormalizeArrivalTimes(piVar6,nVars,&nMax);
  memcpy(pArrTimeProfile,piVar6,__size);
  Vec_IntFree(p);
  return;
}

Assistant:

static void Abc_ExactNormalizeArrivalTimesForNetwork( int nVars, int * pArrTimeProfile, char * pSol )
{
    int nGates, i, j, k, nMax;
    Vec_Int_t * vLevels;

    nGates = pSol[ABC_EXACT_SOL_NGATES];

    /* printf( "NORMALIZE\n" ); */
    /* printf( "  #vars  = %d\n", nVars ); */
    /* printf( "  #gates = %d\n", nGates ); */

    vLevels = Vec_IntAllocArrayCopy( pArrTimeProfile, nVars );

    /* compute level of each gate based on arrival time profile (to compute depth) */
    for ( i = 0; i < nGates; ++i )
    {
        j = pSol[3 + i * 4 + 2];
        k = pSol[3 + i * 4 + 3];

        Vec_IntPush( vLevels, Abc_MaxInt( Vec_IntEntry( vLevels, j ), Vec_IntEntry( vLevels, k ) ) + 1 );

        /* printf( "  gate %d = (%d,%d)\n", nVars + i, j, k ); */
    }

    /* Vec_IntPrint( vLevels ); */

    /* reset all levels except for the last one */
    for ( i = 0; i < nVars + nGates - 1; ++i )
        Vec_IntSetEntry( vLevels, i, Vec_IntEntry( vLevels, nVars + nGates - 1 ) );

    /* Vec_IntPrint( vLevels ); */

    /* compute levels from top to bottom */
    for ( i = nGates - 1; i >= 0; --i )
    {
        j = pSol[3 + i * 4 + 2];
        k = pSol[3 + i * 4 + 3];

        Vec_IntSetEntry( vLevels, j, Abc_MinInt( Vec_IntEntry( vLevels, j ), Vec_IntEntry( vLevels, nVars + i ) - 1 ) );
        Vec_IntSetEntry( vLevels, k, Abc_MinInt( Vec_IntEntry( vLevels, k ), Vec_IntEntry( vLevels, nVars + i ) - 1 ) );
    }

    /* Vec_IntPrint( vLevels ); */

    /* normalize arrival times */
    Abc_NormalizeArrivalTimes( Vec_IntArray( vLevels ), nVars, &nMax );
    memcpy( pArrTimeProfile, Vec_IntArray( vLevels ), sizeof(int) * nVars );

    /* printf( "  nMax = %d\n", nMax ); */
    /* Vec_IntPrint( vLevels ); */

    Vec_IntFree( vLevels );
}